

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

LValue * __thiscall
slang::ast::ConcatenationExpression::evalLValueImpl
          (LValue *__return_storage_ptr__,ConcatenationExpression *this,EvalContext *context)

{
  pointer ppEVar1;
  size_t sVar2;
  __index_type _Var3;
  long lVar4;
  vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> lvals;
  LValue lval;
  vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> local_1d8;
  _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
  local_1b8;
  
  local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::reserve
            (&local_1d8,(this->operands_)._M_extent._M_extent_value);
  ppEVar1 = (this->operands_)._M_ptr;
  sVar2 = (this->operands_)._M_extent._M_extent_value;
  lVar4 = 0;
  do {
    if (sVar2 << 3 == lVar4) {
      LValue::LValue(__return_storage_ptr__,&local_1d8,Packed);
      break;
    }
    Expression::evalLValue((LValue *)&local_1b8,*(Expression **)((long)ppEVar1 + lVar4),context);
    _Var3 = local_1b8._M_index;
    if (local_1b8._M_index == '\0') {
      *(__index_type *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
               .
               super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
               .
               super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
               .
               super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
               .
               super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
               .
               super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
       + 0x180) = '\0';
    }
    else {
      std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::
      emplace_back<slang::ast::LValue>(&local_1d8,(LValue *)&local_1b8);
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>::
    ~_Variant_storage(&local_1b8);
    lVar4 = lVar4 + 8;
  } while (_Var3 != '\0');
  std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::~vector(&local_1d8);
  return __return_storage_ptr__;
}

Assistant:

LValue ConcatenationExpression::evalLValueImpl(EvalContext& context) const {
    std::vector<LValue> lvals;
    lvals.reserve(operands().size());
    for (auto operand : operands()) {
        LValue lval = operand->evalLValue(context);
        if (!lval)
            return nullptr;

        lvals.emplace_back(std::move(lval));
    }

    return LValue(std::move(lvals), LValue::Concat::Packed);
}